

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O2

int __thiscall
GEO::geofile::adjust_lines
          (geofile *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *changes)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Self __tmp_1;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_color _Var6;
  _Rb_tree_color _Var7;
  _Self __tmp;
  _Self __tmp_2;
  node_type nodeHandler;
  node_type local_70;
  insert_return_type local_58;
  
  p_Var1 = &(changes->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var3 = (changes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::
    _Rb_tree<int,_std::pair<const_int,_GEO::line>,_std::_Select1st<std::pair<const_int,_GEO::line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
    ::extract(&local_70,&(this->lines_map)._M_t,(key_type *)(p_Var3 + 1));
    if (local_70.
        super__Node_handle_common<std::pair<const_int,_GEO::line>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::line>_>_>_>
        ._M_ptr != (pointer)0x0) {
      *local_70._M_pkey = *(int *)&p_Var3[1].field_0x4;
      std::
      _Rb_tree<int,_std::pair<const_int,_GEO::line>,_std::_Select1st<std::pair<const_int,_GEO::line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
      ::_M_reinsert_node_unique(&local_58,&(this->lines_map)._M_t,&local_70);
      std::
      _Node_handle_common<std::pair<const_int,_GEO::line>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::line>_>_>_>
      ::~_Node_handle_common
                (&local_58.node.
                  super__Node_handle_common<std::pair<const_int,_GEO::line>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::line>_>_>_>
                );
    }
    std::
    _Node_handle_common<std::pair<const_int,_GEO::line>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::line>_>_>_>
    ::~_Node_handle_common
              (&local_70.
                super__Node_handle_common<std::pair<const_int,_GEO::line>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::line>_>_>_>
              );
  }
  for (p_Var3 = (this->curve_loops_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->curve_loops_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    for (p_Var4 = (changes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != p_Var1;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      p_Var2 = p_Var3[1]._M_left;
      for (p_Var5 = p_Var3[1]._M_parent; p_Var5 != p_Var2; p_Var5 = (_Base_ptr)&p_Var5->field_0x4) {
        _Var6 = p_Var5->_M_color;
        _Var7 = p_Var4[1]._M_color;
        if (_Var6 == _Var7) {
          _Var6 = *(_Rb_tree_color *)&p_Var4[1].field_0x4;
          p_Var5->_M_color = _Var6;
          _Var7 = p_Var4[1]._M_color;
        }
        if (_Var7 + _Var6 == 0) {
          p_Var5->_M_color = -*(int *)&p_Var4[1].field_0x4;
        }
      }
    }
  }
  return 0;
}

Assistant:

int GEO::geofile::adjust_lines(std::map<int,int> changes)
{
    auto change_end = changes.end();
    for (auto i = changes.begin(); i != change_end; i++)
    {
        auto nodeHandler = lines_map.extract(i->first);
        if(!nodeHandler.empty())
        {
            nodeHandler.key() = i->second;
            lines_map.insert(std::move(nodeHandler));
        }
    }
    // Adjust dependencies to mirror the changes.
    // Curve loops
    auto c_l_m_end  = curve_loops_map.end();
    for (auto c_l_m_it = curve_loops_map.begin(); c_l_m_it != c_l_m_end; c_l_m_it++)
    {
        for (auto i = changes.begin(); i != change_end; i++)
        {
            auto vec_end = c_l_m_it->second.end();
            for (auto j = c_l_m_it->second.begin(); j != vec_end; j++)
            {
                if(*j==i->first)
                    *j=i->second;
                if(*j==-i->first)
                    *j=-i->second;
            }
        }
    }
    return EXIT_SUCCESS;
}